

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cc
# Opt level: O1

Int __thiscall ipx::Basis::AdaptToSingularFactorization(Basis *this)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  pointer piVar5;
  pointer piVar6;
  size_type __n;
  pointer piVar7;
  long lVar8;
  long lVar9;
  vector<int,_std::allocator<int>_> colperm;
  vector<int,_std::allocator<int>_> dependent_cols;
  vector<int,_std::allocator<int>_> rowperm;
  vector<int,_std::allocator<int>_> local_70;
  vector<int,_std::allocator<int>_> local_58;
  vector<int,_std::allocator<int>_> local_38;
  
  __n = (size_type)this->model_->num_rows_;
  iVar1 = this->model_->num_cols_;
  std::vector<int,_std::allocator<int>_>::vector(&local_38,__n,(allocator_type *)&local_70);
  std::vector<int,_std::allocator<int>_>::vector(&local_70,__n,(allocator_type *)&local_58);
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  LuUpdate::GetFactors
            ((this->lu_)._M_t.
             super___uniq_ptr_impl<ipx::LuUpdate,_std::default_delete<ipx::LuUpdate>_>._M_t.
             super__Tuple_impl<0UL,_ipx::LuUpdate_*,_std::default_delete<ipx::LuUpdate>_>.
             super__Head_base<0UL,_ipx::LuUpdate_*,_false>._M_head_impl,(SparseMatrix *)0x0,
             (SparseMatrix *)0x0,
             local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,&local_58);
  piVar6 = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  piVar5 = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    piVar3 = (this->basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (this->map2basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar7 = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    do {
      iVar2 = local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[*piVar7];
      lVar8 = (long)piVar3[iVar2];
      lVar9 = (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[*piVar7] + (long)iVar1;
      piVar3[iVar2] = (int)lVar9;
      piVar4[lVar9] = iVar2;
      if (-1 < lVar8) {
        piVar4[lVar8] = -1;
      }
      piVar7 = piVar7 + 1;
    } while (piVar7 != local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (Int *)0x0) {
    operator_delete(local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (Int *)0x0) {
    operator_delete(local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return (Int)((ulong)((long)piVar6 - (long)piVar5) >> 2);
}

Assistant:

Int Basis::AdaptToSingularFactorization() {
    const Int m = model_.rows();
    const Int n = model_.cols();
    std::vector<Int> rowperm(m), colperm(m), dependent_cols;

    lu_->GetFactors(nullptr, nullptr, rowperm.data(), colperm.data(),
                    &dependent_cols);
    for (Int k : dependent_cols) {
        // Column p of the basis matrix was replaced by the i-th unit
        // column. Insert the corresponding slack variable jn into
        // position p of the basis.
        Int p = colperm[k];
        Int i = rowperm[k];
        Int jb = basis_[p];
        Int jn = n+i;
        assert(map2basis_[jn] < 0);
        basis_[p] = jn;
        map2basis_[jn] = p; // now BASIC at position p
        if (jb >= 0)
            map2basis_[jb] = -1; // now NONBASIC
    }
    return dependent_cols.size();
}